

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O2

void __thiscall
Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,-1,1,false>>::
visit<Eigen::internal::max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,_1,1,false>,0>>
          (DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,_1,1,false>> *this,
          max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>,_0>
          *visitor)

{
  ThisEvaluator thisEval;
  visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_18;
  
  if (*(long *)(this + 8) != 0) {
    local_18.m_evaluator.
    super_block_evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_3,_1>_>
    .m_data = *(PointerType *)this;
    local_18.m_xpr = (Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false> *)this;
    internal::
    visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>,_0>,_Eigen::internal::visitor_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>,_-1>
    ::run(&local_18,visitor);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void DenseBase<Derived>::visit(Visitor& visitor) const
{
  if(size()==0)
    return;

  typedef typename internal::visitor_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  enum {
    unroll =  SizeAtCompileTime != Dynamic
           && SizeAtCompileTime * int(ThisEvaluator::CoeffReadCost) + (SizeAtCompileTime-1) * int(internal::functor_traits<Visitor>::Cost) <= EIGEN_UNROLLING_LIMIT
  };
  return internal::visitor_impl<Visitor, ThisEvaluator, unroll ? int(SizeAtCompileTime) : Dynamic>::run(thisEval, visitor);
}